

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void whereClauseClear(WhereClause *pWC)

{
  sqlite3 *db;
  WhereOrInfo *pWC_00;
  byte bVar1;
  uint uVar2;
  u8 *puVar3;
  WhereTerm *p;
  
  db = pWC->pParse->db;
  p = pWC->a;
  if (0 < pWC->nTerm) {
    uVar2 = pWC->nTerm + 1;
    puVar3 = &p->wtFlags;
    do {
      bVar1 = *puVar3;
      if ((bVar1 & 1) != 0) {
        sqlite3ExprDelete(db,((WhereTerm *)(puVar3 + -0x1a))->pExpr);
        bVar1 = *puVar3;
      }
      if ((bVar1 & 0x30) != 0) {
        pWC_00 = ((anon_union_8_3_737c4e49_for_u *)(puVar3 + -10))->pOrInfo;
        whereClauseClear(&pWC_00->wc);
        sqlite3DbFree(db,pWC_00);
      }
      uVar2 = uVar2 - 1;
      puVar3 = puVar3 + 0x38;
    } while (1 < uVar2);
    p = pWC->a;
  }
  if (p != pWC->aStatic) {
    sqlite3DbFree(db,p);
    return;
  }
  return;
}

Assistant:

static void whereClauseClear(WhereClause *pWC){
  int i;
  WhereTerm *a;
  sqlite3 *db = pWC->pParse->db;
  for(i=pWC->nTerm-1, a=pWC->a; i>=0; i--, a++){
    if( a->wtFlags & TERM_DYNAMIC ){
      sqlite3ExprDelete(db, a->pExpr);
    }
    if( a->wtFlags & TERM_ORINFO ){
      whereOrInfoDelete(db, a->u.pOrInfo);
    }else if( a->wtFlags & TERM_ANDINFO ){
      whereAndInfoDelete(db, a->u.pAndInfo);
    }
  }
  if( pWC->a!=pWC->aStatic ){
    sqlite3DbFree(db, pWC->a);
  }
}